

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O1

iterator_range<burst::bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>_>
* __thiscall
burst::
bitap<std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>,std::forward_list<int,std::allocator<int>>,std::forward_list<int,std::allocator<int>>>
          (iterator_range<burst::bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,burst *this,forward_list<int,_std::allocator<int>_> *pattern,
          forward_list<int,_std::allocator<int>_> *text)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
  begin;
  bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
  bitap;
  forward_list<int,_std::allocator<int>_> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
  local_b8;
  forward_list<int,_std::allocator<int>_> *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _WordT local_68;
  _Fwd_list_node_base *p_Stack_60;
  _Fwd_list_node_base *local_58;
  _Fwd_list_node_base *p_Stack_50;
  bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
  local_48;
  
  algorithm::
  bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
  ::bitap<std::forward_list<int,std::allocator<int>>>
            ((bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>
              *)&local_88,(forward_list<int,_std::allocator<int>_> *)this);
  local_c8 = local_88;
  local_c0 = local_80;
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_88 = (forward_list<int,_std::allocator<int>_> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_80->_M_use_count = local_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_80->_M_use_count = local_80->_M_use_count + 1;
    }
  }
  make_bitap_iterator<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>,std::forward_list<int,std::allocator<int>>>
            (&local_b8,(burst *)&local_c8,
             (bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>
              *)pattern,local_88);
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  this_00._M_pi =
       local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_78 = local_b8.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_70 = local_b8.m_bitap.m_bitmask_table.
             super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = local_b8.m_match.
             super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_node;
  p_Stack_50 = local_b8.m_text_end._M_node;
  local_68 = (_WordT)local_b8.m_hint.super__Base_bitset<1UL>._M_w;
  p_Stack_60 = local_b8.m_match.
               super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
  local_48.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_48.m_bitap.m_bitmask_table.
  super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_b8.m_bitap.m_bitmask_table.
    super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_b8.m_bitap.m_bitmask_table.
       super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_b8.m_bitap.m_bitmask_table.
            super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.m_hint.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_48.m_match.
  super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_node = local_b8.m_text_end._M_node;
  local_48.m_match.
  super_iterator_range_base<std::_Fwd_list_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_node = local_b8.m_text_end._M_node;
  local_48.m_text_end._M_node = local_b8.m_text_end._M_node;
  boost::
  make_iterator_range<burst::bitap_iterator<burst::algorithm::bitap<int,std::bitset<32ul>,std::unordered_map<int,std::bitset<32ul>,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::bitset<32ul>>>>>,std::forward_list<int,std::allocator<int>>>>
            (__return_storage_ptr__,(boost *)&local_78,&local_48,
             (bitap_iterator<burst::algorithm::bitap<int,_std::bitset<32UL>,_std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_std::forward_list<int,_std::allocator<int>_>_>
              *)local_b8.m_bitap.m_bitmask_table.
                super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr);
  if (local_48.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_b8.m_bitap.m_bitmask_table.
      super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.m_bitap.m_bitmask_table.
               super___shared_ptr<const_burst::algorithm::detail::element_position_bitmask_table<std::unordered_map<int,_std::bitset<32UL>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::bitset<32UL>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

auto bitap (const ForwardRange1 & pattern, const ForwardRange2 & text)
    {
        auto bitap = algorithm::make_bitap<Bitmask, Map>(pattern);
        auto begin = make_bitap_iterator(std::move(bitap), text);
        auto end = make_bitap_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }